

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

void __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::unget(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        *this)

{
  int iVar1;
  int_type iVar2;
  element_type *peVar3;
  size_type sVar4;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_local;
  
  this->chars_read = this->chars_read - 1;
  iVar1 = this->current;
  iVar2 = std::char_traits<char>::eof();
  if (iVar1 != iVar2) {
    peVar3 = std::
             __shared_ptr_access<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    (*peVar3->_vptr_input_adapter_protocol[1])();
    sVar4 = std::vector<char,_std::allocator<char>_>::size(&this->token_string);
    if (sVar4 == 0) {
      __assert_fail("token_string.size() != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zek[P]Bridge-Game/json.hh"
                    ,0xa91,
                    "void nlohmann::detail::lexer<nlohmann::basic_json<>>::unget() [BasicJsonType = nlohmann::basic_json<>]"
                   );
    }
    std::vector<char,_std::allocator<char>_>::pop_back(&this->token_string);
  }
  return;
}

Assistant:

void unget()
    {
        --chars_read;
        if (JSON_LIKELY(current != std::char_traits<char>::eof()))
        {
            ia->unget_character();
            assert(token_string.size() != 0);
            token_string.pop_back();
        }
    }